

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O1

bool check_qclab_qgates_RotationY<float>
               (vector<float,_std::allocator<float>_> *v1,vector<float,_std::allocator<float>_> *v2)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pfVar1 = (v1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar2 = (v1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar5 = (long)pfVar2 - (long)pfVar1;
  pfVar3 = (v2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (lVar5 != (long)(v2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar3) {
    __assert_fail("v1.size() == v2.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/RotationY.cpp"
                  ,0xb,
                  "bool check_qclab_qgates_RotationY(const std::vector<T> &, const std::vector<T> &) [T = float]"
                 );
  }
  bVar8 = pfVar2 == pfVar1;
  if (!bVar8) {
    uVar6 = lVar5 >> 2;
    if (ABS(*pfVar1 - *pfVar3) <= 1.1920929e-05) {
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        if (uVar6 + (uVar6 == 0) == uVar7) break;
        uVar4 = uVar7 + 1;
      } while (ABS(pfVar1[uVar7] - pfVar3[uVar7]) <= 1.1920929e-05);
      bVar8 = uVar6 <= uVar7;
    }
  }
  return bVar8;
}

Assistant:

bool check_qclab_qgates_RotationY( const std::vector< T >& v1 ,
                                   const std::vector< T >& v2 ) {

  using R = qclab::real_t< T > ;
  const R tol = 100 * std::numeric_limits< R >::epsilon() ;

  assert( v1.size() == v2.size() ) ;
  for ( size_t i = 0; i < v1.size(); ++i ) {
    if ( std::abs( v1[i] - v2[i] ) > tol ) return false ;
  }
  return true ;

}